

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

string * sha256(string *input)

{
  uint len;
  uchar *message;
  EVP_PKEY_CTX *ctx_00;
  allocator local_12d;
  uint local_12c;
  char local_128 [4];
  int i;
  char buf [65];
  SHA256 ctx;
  uchar digest [32];
  string *input_local;
  
  memset(ctx.m_h + 6,0,0x20);
  ctx_00 = (EVP_PKEY_CTX *)0x0;
  memset(buf + 0x40,0,0xa8);
  SHA256::init((SHA256 *)(buf + 0x40),ctx_00);
  message = (uchar *)std::__cxx11::string::c_str();
  len = std::__cxx11::string::length();
  SHA256::update((SHA256 *)(buf + 0x40),message,len);
  SHA256::final((SHA256 *)(buf + 0x40),(uchar *)(ctx.m_h + 6));
  buf[0x38] = '\0';
  for (local_12c = 0; local_12c < 0x20; local_12c = local_12c + 1) {
    sprintf(local_128 + (int)(local_12c << 1),"%02x",
            (ulong)*(byte *)((long)ctx.m_h + (long)(int)local_12c + 0x18));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)input,local_128,&local_12d);
  std::allocator<char>::~allocator((allocator<char> *)&local_12d);
  return input;
}

Assistant:

std::string sha256(std::string input)
{
    unsigned char digest[SHA256::DIGEST_SIZE];
    memset(digest,0,SHA256::DIGEST_SIZE);
 
    SHA256 ctx = SHA256();
    ctx.init();
    ctx.update( (unsigned char*)input.c_str(), input.length());
    ctx.final(digest);
 
    char buf[2*SHA256::DIGEST_SIZE+1];
    buf[2*SHA256::DIGEST_SIZE] = 0;
    for (int i = 0; i < SHA256::DIGEST_SIZE; i++)
        sprintf(buf+i*2, "%02x", digest[i]);
    return std::string(buf);
}